

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerFastAllocator.h
# Opt level: O0

void Memory::RecyclerFastAllocator<Js::JavascriptNumber,_(Memory::ObjectInfoBits)32>::
     TrackNativeAllocatedObject(Recycler *recycler,void *memBlock,size_t sizeCat)

{
  undefined1 local_48 [8];
  TrackAllocData trackAllocData;
  size_t sizeCat_local;
  void *memBlock_local;
  Recycler *recycler_local;
  
  trackAllocData._32_8_ = sizeCat;
  memcpy(local_48,&PTR_typeinfo_01de1a60,0x28);
  Recycler::TrackAlloc(recycler,memBlock,8,(TrackAllocData *)local_48,false);
  RecyclerMemoryTracking::ReportAllocation(recycler,memBlock,8);
  Recycler::FillCheckPad(recycler,memBlock,8,trackAllocData._32_8_,true);
  return;
}

Assistant:

static void TrackNativeAllocatedObject(Recycler * recycler, void * memBlock, size_t sizeCat)
    {
#ifdef PROFILE_RECYCLER_ALLOC
        TrackAllocData trackAllocData = { &typeid(T), 0, (size_t)-1, NULL, 0 };
        recycler->TrackAlloc(memBlock, sizeof(T), trackAllocData);
#endif
        RecyclerMemoryTracking::ReportAllocation(recycler, memBlock, sizeof(T));
        RECYCLER_PERF_COUNTER_INC(LiveObject);
        RECYCLER_PERF_COUNTER_ADD(LiveObjectSize, sizeCat);
        RECYCLER_PERF_COUNTER_SUB(FreeObjectSize, sizeCat);

        RECYCLER_PERF_COUNTER_INC(SmallHeapBlockLiveObject);
        RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockLiveObjectSize, sizeCat);
        RECYCLER_PERF_COUNTER_SUB(SmallHeapBlockFreeObjectSize, sizeCat);

#ifdef RECYCLER_MEMORY_VERIFY
        recycler->FillCheckPad(memBlock, sizeof(T), sizeCat, true);
#endif
    }